

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_instances.c
# Opt level: O1

picnic_instance_t * picnic_instance_get(picnic_params_t param)

{
  uint uVar1;
  picnic_instance_t *ppVar2;
  
  if (param - PARAMETER_SET_MAX_INDEX < 0xfffffff4) {
    return (picnic_instance_t *)0x0;
  }
  uVar1 = param - Picnic_L3_UR;
  if (param < Picnic3_L1) {
    uVar1 = param - Picnic_L1_FS >> 1;
  }
  ppVar2 = (picnic_instance_t *)0x0;
  if (instances[uVar1].lowmc.n != 0) {
    ppVar2 = instances + uVar1;
  }
  return ppVar2;
}

Assistant:

const picnic_instance_t* picnic_instance_get(picnic_params_t param) {
  if (param <= PARAMETER_SET_INVALID || param >= PARAMETER_SET_MAX_INDEX) {
    return NULL;
  }
#if !defined(WITH_UNRUH)
  // because the FS and Unruh instances are interleaved, we need to explicitely check for them
  if (picnic_instance_is_unruh(param)) {
    return NULL;
  }
#endif

  const picnic_instance_t* pp =
      &instances[param <= Picnic_L5_UR ? (param - 1) / 2 : param - Picnic3_L1 + 3];
  // check if the LowMC instance and ZKBPP/KKW are enabled
  return pp->lowmc.n ? pp : NULL;
}